

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char **ppcVar2;
  char *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  int iVar7;
  
  iVar7 = 0;
  iVar4 = 0;
  ppcVar2 = nextTokPtr;
  pcVar3 = end;
LAB_00152a76:
  pbVar6 = (byte *)ptr;
  if (pbVar6 == (byte *)end) {
    return -1;
  }
  iVar5 = iVar4;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar6)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    ptr = (char *)(pbVar6 + 1);
    if (ptr == end) {
      return -1;
    }
    if (*ptr == 0x21) {
      ptr = (char *)(pbVar6 + 2);
      if (ptr == end) {
        return -1;
      }
      if (*ptr == 0x5b) {
        iVar7 = iVar7 + 1;
        goto LAB_00152b22;
      }
    }
    goto LAB_00152a76;
  default:
    ptr = (char *)(pbVar6 + 1);
    goto LAB_00152a76;
  case 4:
    ptr = (char *)(pbVar6 + 1);
    if (ptr == end) {
      return -1;
    }
    if (*ptr != 0x5d) goto LAB_00152a76;
    ptr = (char *)(pbVar6 + 2);
    if (ptr == end) {
      return -1;
    }
    if (*ptr != 0x3e) goto LAB_00152a76;
    pbVar6 = pbVar6 + 3;
    if (iVar7 != 0) {
      iVar7 = iVar7 + -1;
      ptr = (char *)pbVar6;
      goto LAB_00152a76;
    }
    iVar5 = 0x2a;
    break;
  case 5:
    if ((long)end - (long)pbVar6 < 2) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[2])(enc,(char *)pbVar6,pcVar3,ppcVar2);
    iVar5 = 0;
    if (iVar1 == 0) {
      pcVar3 = extraout_RDX_01;
      ptr = (char *)(pbVar6 + 2);
      goto LAB_00152a76;
    }
    break;
  case 6:
    if ((long)end - (long)pbVar6 < 3) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[3])(enc,(char *)pbVar6,pcVar3,ppcVar2);
    pcVar3 = extraout_RDX_00;
    if (iVar1 != 0) break;
LAB_00152b22:
    ptr = (char *)(pbVar6 + 3);
    goto LAB_00152a76;
  case 7:
    if ((long)end - (long)pbVar6 < 4) {
      return -2;
    }
    iVar1 = (*enc[3].literalScanners[0])(enc,(char *)pbVar6,pcVar3,ppcVar2);
    if (iVar1 != 0) break;
    pcVar3 = extraout_RDX;
    ptr = (char *)(pbVar6 + 4);
    goto LAB_00152a76;
  }
  *nextTokPtr = (char *)pbVar6;
  return iVar5;
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}